

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDBusMenuEvent>::reallocateAndGrow
          (QArrayDataPointer<QDBusMenuEvent> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QDBusMenuEvent> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QDBusMenuEvent> *this_00;
  QDBusMenuEvent *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QDBusMenuEvent> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QDBusMenuEvent> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QDBusMenuEvent *in_stack_ffffffffffffff80;
  QDBusMenuEvent *in_stack_ffffffffffffff88;
  QGenericArrayOps<QDBusMenuEvent> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QDBusMenuEvent> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QDBusMenuEvent> *)
                  operator->((QArrayDataPointer<QDBusMenuEvent> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0d5dc);
        begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0d5eb);
        QtPrivate::QGenericArrayOps<QDBusMenuEvent>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QDBusMenuEvent *)
             operator->((QArrayDataPointer<QDBusMenuEvent> *)&stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0d621);
        begin((QArrayDataPointer<QDBusMenuEvent> *)0xb0d630);
        QtPrivate::QGenericArrayOps<QDBusMenuEvent>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QDBusMenuEvent> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QDBusMenuEvent> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QDBusMenuEvent> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QDBusMenuEvent>::reallocate
              ((QMovableArrayOps<QDBusMenuEvent> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }